

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int ShouldCompress(uint8_t *input,size_t input_size,size_t num_literals)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double local_448;
  uint32_t literal_histo [256];
  
  auVar7._8_4_ = (int)(input_size >> 0x20);
  auVar7._0_8_ = input_size;
  auVar7._12_4_ = 0x45300000;
  dVar11 = (auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)input_size) - 4503599627370496.0);
  auVar8._8_4_ = (int)(num_literals >> 0x20);
  auVar8._0_8_ = num_literals;
  auVar8._12_4_ = 0x45300000;
  if ((auVar8._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)num_literals) - 4503599627370496.0) < dVar11 * 0.98) {
    return 1;
  }
  memset(literal_histo,0,0x400);
  for (uVar3 = 0; uVar3 < input_size; uVar3 = uVar3 + 0x2b) {
    literal_histo[input[uVar3]] = literal_histo[input[uVar3]] + 1;
  }
  dVar10 = 0.0;
  uVar3 = 0;
  for (uVar4 = 0; uVar4 < 0x400; uVar4 = uVar4 + 8) {
    uVar1 = (ulong)*(uint *)((long)literal_histo + uVar4);
    if (uVar1 < 0x100) {
      dVar5 = kLog2Table[uVar1];
      local_448 = (double)(int)*(uint *)((long)literal_histo + uVar4);
    }
    else {
      local_448 = (double)uVar1;
      dVar5 = log2(local_448);
    }
    uVar2 = (ulong)*(uint *)((long)literal_histo + uVar4 + 4);
    if (uVar2 < 0x100) {
      dVar6 = kLog2Table[uVar2];
    }
    else {
      dVar6 = log2((double)uVar2);
    }
    uVar3 = uVar3 + uVar1 + uVar2;
    dVar10 = (dVar10 - local_448 * dVar5) - (double)uVar2 * dVar6;
  }
  auVar9._8_4_ = (int)(uVar3 >> 0x20);
  auVar9._0_8_ = uVar3;
  auVar9._12_4_ = 0x45300000;
  dVar5 = (auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
  if (uVar3 != 0) {
    if (uVar3 < 0x100) {
      dVar6 = kLog2Table[uVar3];
    }
    else {
      dVar6 = log2(dVar5);
    }
    dVar10 = dVar10 + dVar6 * dVar5;
  }
  if (dVar5 <= dVar10) {
    dVar5 = dVar10;
  }
  return (int)(dVar5 < (dVar11 * 8.0 * 0.98) / 43.0);
}

Assistant:

static BROTLI_BOOL ShouldCompress(
    const uint8_t* data, const size_t mask, const uint64_t last_flush_pos,
    const size_t bytes, const size_t num_literals, const size_t num_commands) {
  /* TODO: find more precise minimal block overhead. */
  if (bytes <= 2) return BROTLI_FALSE;
  if (num_commands < (bytes >> 8) + 2) {
    if ((double)num_literals > 0.99 * (double)bytes) {
      uint32_t literal_histo[256] = { 0 };
      static const uint32_t kSampleRate = 13;
      static const double kMinEntropy = 7.92;
      const double bit_cost_threshold =
          (double)bytes * kMinEntropy / kSampleRate;
      size_t t = (bytes + kSampleRate - 1) / kSampleRate;
      uint32_t pos = (uint32_t)last_flush_pos;
      size_t i;
      for (i = 0; i < t; i++) {
        ++literal_histo[data[pos & mask]];
        pos += kSampleRate;
      }
      if (BitsEntropy(literal_histo, 256) > bit_cost_threshold) {
        return BROTLI_FALSE;
      }
    }
  }
  return BROTLI_TRUE;
}